

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O1

int CVodeGetNumErrTestFails(void *cvode_mem,long *netfails)

{
  int iVar1;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeGetNumErrTestFails","cvode_mem = NULL illegal."
                  );
  }
  else {
    *netfails = *(long *)((long)cvode_mem + 0x380);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeGetNumErrTestFails(void *cvode_mem, long int *netfails)
{
  CVodeMem cv_mem;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeGetNumErrTestFails", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  *netfails = cv_mem->cv_netf;

  return(CV_SUCCESS);
}